

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O3

bool __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::IsGB(MI<136UL,_GF2::MOGrevlex<136UL>_> *this)

{
  _List_node_base *p_Var1;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *pMVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  bool bVar5;
  size_t i;
  ulong uVar6;
  _List_node_base *p_Var7;
  ulong uVar8;
  long lVar9;
  _List_node_base *p_Var10;
  MP<136UL,_GF2::MOGrevlex<136UL>_> poly;
  MP<136UL,_GF2::MOGrevlex<136UL>_> local_50;
  
  local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node._M_size = 0;
  bVar5 = true;
  p_Var10 = (_List_node_base *)&local_50;
  local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_50;
  if ((this->
      super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
      ).
      super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this) {
    lVar9 = 0;
    p_Var10 = (_List_node_base *)this;
    do {
      uVar6 = 0;
      do {
        if (((ulong)(&p_Var10->_M_prev[1]._M_next[1]._M_next)[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) !=
            0) {
          pMVar2 = MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
                             (&local_50,uVar6,
                              (MP<136UL,_GF2::MOGrevlex<136UL>_> *)(p_Var10->_M_prev + 1));
          Reduce(this,pMVar2);
          if (local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
              super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
              _M_size != 0) goto LAB_00126328;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x88);
      p_Var3 = (this->
               super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
               ).
               super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      p_Var7 = p_Var10->_M_prev;
      if (p_Var10->_M_prev != p_Var3) {
        do {
          p_Var1 = p_Var10->_M_prev[1]._M_next;
          p_Var4 = p_Var7->_M_prev;
          if (((ulong)p_Var1[1]._M_next & (ulong)p_Var4[1]._M_next[1]._M_next) == 0) {
            uVar6 = 0;
            do {
              uVar8 = uVar6;
              if (uVar8 == 2) goto LAB_001262d1;
              uVar6 = uVar8 + 1;
            } while (((ulong)(&p_Var1[1]._M_prev)[uVar8] &
                     (ulong)(&p_Var4[1]._M_next[1]._M_prev)[uVar8]) == 0);
            if (uVar8 < 2) goto LAB_001262a7;
          }
          else {
LAB_001262a7:
            pMVar2 = MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
                               (&local_50,
                                (MP<136UL,_GF2::MOGrevlex<136UL>_> *)(p_Var10->_M_prev + 1),
                                (MP<136UL,_GF2::MOGrevlex<136UL>_> *)(p_Var4 + 1));
            Reduce(this,pMVar2);
            if (local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
                super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
                _M_size != 0) goto LAB_00126328;
            p_Var4 = p_Var7->_M_prev;
            p_Var3 = (this->
                     super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                     ).
                     super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
          }
LAB_001262d1:
          p_Var7 = p_Var4;
        } while (p_Var4 != p_Var3);
      }
      lVar9 = lVar9 + 1;
      Env::Trace("IsGB: %zu polys",lVar9);
      p_Var10 = p_Var10->_M_prev;
    } while (p_Var10 !=
             (this->
             super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
             ).
             super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next);
    bVar5 = true;
    p_Var10 = local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
              super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
              super__List_node_base._M_next;
  }
joined_r0x00126332:
  while (p_Var10 != (_List_node_base *)&local_50) {
    p_Var3 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var10->_M_next)->
             super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var10,0x28);
    p_Var10 = p_Var3;
  }
  return bVar5;
LAB_00126328:
  bVar5 = false;
  p_Var10 = local_50.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
            super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
            super__List_node_base._M_next;
  goto joined_r0x00126332;
}

Assistant:

bool IsGB() const
	{
		MP<_n, _O> poly(_order);
		// цикл по многочленам
		size_t trace = 0;
        for (const_reverse_iterator iter = rbegin(); iter != rend(); ++iter)
		{
			// цикл по парам (многочлен, уравнение поля)
			for (size_t i = 0; i < _n; i++)
				if (iter->LM().Test(i))
				{
					Reduce(poly.SPoly(i, *iter));
					if (poly != 0)
						return false;
				}
			// цикл по парам (многочлен, многочлен1)
			const_reverse_iterator iter1 = iter;
			for (++iter1; iter1 != rend(); ++iter1)
				if (!iter->LM().IsRelPrime(iter1->LM()))
				{
					Reduce(poly.SPoly(*iter, *iter1));
					if (poly != 0) 
						return false;
				}
			// трассировка
			Env::Trace("IsGB: %zu polys", ++trace);
		}
		return true;
	}